

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainNamingConventions.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char **__args;
  ulong uVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filenames;
  
  filenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  filenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  filenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __args = argv + 1;
  for (uVar1 = 1; uVar1 < (uint)argc; uVar1 = uVar1 + 1) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::emplace_back<char*&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&filenames,
               __args);
    __args = __args + 1;
  }
  namingConventions::convertToConventions(&filenames);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&filenames);
  return 0;
}

Assistant:

int main(int argc, char** argv){
std::vector<std::string> filenames;

    for (unsigned int file = 1; file < argc; ++file) {
        filenames.emplace_back(argv[file]);
    }
    namingConventions::convertToConventions(filenames);

//    namingConventions::namingConventionsClasses(filenames);
//    namingConventions::namingConventionsVariables(filenames);
//    namingConventions::namingConventionsFunctions(filenames);

}